

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

uint duckdb_je_arena_nthreads_get(arena_t *arena,_Bool internal)

{
  undefined3 in_register_00000031;
  
  return arena->nthreads[CONCAT31(in_register_00000031,internal)].repr;
}

Assistant:

unsigned
arena_nthreads_get(arena_t *arena, bool internal) {
	return atomic_load_u(&arena->nthreads[internal], ATOMIC_RELAXED);
}